

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qrhiwidget.cpp
# Opt level: O3

void QRhiWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSize *pQVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  TextureFormat TVar5;
  QSize QVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        iVar7 = 0;
LAB_002b7372:
        QMetaObject::activate(_o,&staticMetaObject,iVar7,(void **)0x0);
        return;
      }
      goto LAB_002b740d;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        iVar7 = 1;
        goto LAB_002b7372;
      }
      goto LAB_002b740d;
    case 2:
      local_2c = *_a[1];
      local_20 = &local_2c;
      iVar7 = 2;
      break;
    case 3:
      local_2c = *_a[1];
      local_20 = &local_2c;
      iVar7 = 3;
      break;
    case 4:
      local_20 = (undefined4 *)_a[1];
      iVar7 = 4;
      break;
    case 5:
      local_20 = &local_2c;
      local_2c = CONCAT31(local_2c._1_3_,*_a[1]);
      iVar7 = 5;
      break;
    default:
      goto switchD_002b713c_caseD_3;
    }
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar7,&local_28);
    break;
  case ReadProperty:
    if (3 < (uint)_id) break;
    pQVar1 = (QSize *)*_a;
    switch(_id) {
    case 0:
      TVar5 = sampleCount((QRhiWidget *)_o);
      goto LAB_002b72cd;
    case 1:
      TVar5 = colorBufferFormat((QRhiWidget *)_o);
LAB_002b72cd:
      (pQVar1->wd).m_i = TVar5;
      break;
    case 2:
      QVar6 = fixedColorBufferSize((QRhiWidget *)_o);
      *pQVar1 = QVar6;
      break;
    case 3:
      bVar4 = isMirrorVerticallyEnabled((QRhiWidget *)_o);
      *(bool *)&(pQVar1->wd).m_i = bVar4;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      pQVar1 = (QSize *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          setSampleCount((QRhiWidget *)_o,(pQVar1->wd).m_i);
          return;
        }
        break;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          setColorBufferFormat((QRhiWidget *)_o,(pQVar1->wd).m_i);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          setFixedColorBufferSize((QRhiWidget *)_o,*pQVar1);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          setMirrorVertically((QRhiWidget *)_o,SUB41((pQVar1->wd).m_i,0));
          return;
        }
      }
      goto LAB_002b740d;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == frameSubmitted && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == renderFailed && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == sampleCountChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == colorBufferFormatChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar2 == fixedColorBufferSizeChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar2 == mirrorVerticallyChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 5;
    }
  }
switchD_002b713c_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_002b740d:
  __stack_chk_fail();
}

Assistant:

void QRhiWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QRhiWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->frameSubmitted(); break;
        case 1: _t->renderFailed(); break;
        case 2: _t->sampleCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->colorBufferFormatChanged((*reinterpret_cast< std::add_pointer_t<TextureFormat>>(_a[1]))); break;
        case 4: _t->fixedColorBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 5: _t->mirrorVerticallyChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)()>(_a, &QRhiWidget::frameSubmitted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)()>(_a, &QRhiWidget::renderFailed, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(int )>(_a, &QRhiWidget::sampleCountChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(TextureFormat )>(_a, &QRhiWidget::colorBufferFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(const QSize & )>(_a, &QRhiWidget::fixedColorBufferSizeChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(bool )>(_a, &QRhiWidget::mirrorVerticallyChanged, 5))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->sampleCount(); break;
        case 1: *reinterpret_cast<TextureFormat*>(_v) = _t->colorBufferFormat(); break;
        case 2: *reinterpret_cast<QSize*>(_v) = _t->fixedColorBufferSize(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isMirrorVerticallyEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSampleCount(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setColorBufferFormat(*reinterpret_cast<TextureFormat*>(_v)); break;
        case 2: _t->setFixedColorBufferSize(*reinterpret_cast<QSize*>(_v)); break;
        case 3: _t->setMirrorVertically(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}